

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodebuild_gl.cpp
# Opt level: O2

DWORD __thiscall
FNodeBuilder::AddMiniseg(FNodeBuilder *this,int v1,int v2,DWORD partner,DWORD seg1,DWORD splitseg)

{
  FPrivSeg *pFVar1;
  FPrivVert *pFVar2;
  uint uVar3;
  FPrivSeg local_78;
  
  pFVar1 = (this->Segs).Array;
  local_78.sidedef = -1;
  local_78.linedef = -1;
  local_78.loopnum = 0;
  local_78.planefront = true;
  local_78.hashnext = (FPrivSeg *)0x0;
  local_78.storedseg = 0xffffffff;
  local_78.frontsector = (sector_t_conflict *)0x0;
  local_78.backsector = (sector_t_conflict *)0x0;
  if (splitseg == 0xffffffff) {
    local_78.planenum = -1;
  }
  else {
    local_78.planenum = pFVar1[splitseg].planenum;
  }
  pFVar2 = (this->Vertices).Array;
  local_78.nextforvert = pFVar2[v1].segs;
  local_78.nextforvert2 = pFVar2[v2].segs2;
  local_78.next = pFVar1[seg1].next;
  local_78.v1 = v1;
  local_78.v2 = v2;
  local_78.partner = partner;
  uVar3 = TArray<FNodeBuilder::FPrivSeg,_FNodeBuilder::FPrivSeg>::Push(&this->Segs,&local_78);
  if (local_78.partner != 0xffffffff) {
    (this->Segs).Array[partner].partner = uVar3;
  }
  pFVar2 = (this->Vertices).Array;
  pFVar2[v1].segs = uVar3;
  pFVar2[v2].segs2 = uVar3;
  return uVar3;
}

Assistant:

DWORD FNodeBuilder::AddMiniseg (int v1, int v2, DWORD partner, DWORD seg1, DWORD splitseg)
{
	DWORD nseg;
	FPrivSeg *seg = &Segs[seg1];
	FPrivSeg newseg;

	newseg.sidedef = NO_SIDE;
	newseg.linedef = -1;
	newseg.loopnum = 0;
	newseg.next = DWORD_MAX;
	newseg.planefront = true;
	newseg.hashnext = NULL;
	newseg.storedseg = DWORD_MAX;
	newseg.frontsector = NULL;
	newseg.backsector = NULL;

	if (splitseg != DWORD_MAX)
	{
		newseg.planenum = Segs[splitseg].planenum;
	}
	else
	{
		newseg.planenum = -1;
	}

	newseg.v1 = v1;
	newseg.v2 = v2;
	newseg.nextforvert = Vertices[v1].segs;
	newseg.nextforvert2 = Vertices[v2].segs2;
	newseg.next = seg->next;
	if (partner != DWORD_MAX)
	{
		newseg.partner = partner;
	}
	else
	{
		newseg.partner = DWORD_MAX;
	}
	nseg = Segs.Push (newseg);
	if (newseg.partner != DWORD_MAX)
	{
		Segs[partner].partner = nseg;
	}
	Vertices[v1].segs = nseg;
	Vertices[v2].segs2 = nseg;
	//Printf ("Between %d and %d::::\n", seg1, seg2);
	return nseg;
}